

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

float_t __thiscall djb::tab_r::cdf1(tab_r *this,float_t u1,float_t zi)

{
  vec2 vVar1;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  vec2 local_40;
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  
  local_40.x = 0.0;
  local_40.y = 1.0;
  vVar1 = cdfv(this,&local_40,zi);
  local_28._8_4_ = extraout_XMM0_Dc;
  local_28._0_4_ = vVar1.x;
  local_28._4_4_ = vVar1.y;
  local_28._12_4_ = extraout_XMM0_Dd;
  local_40.x = 1.0;
  local_40.y = 1.0;
  vVar1 = cdfv(this,&local_40,zi);
  local_38._8_4_ = extraout_XMM0_Dc_00;
  local_38._0_4_ = vVar1.x;
  local_38._4_4_ = vVar1.y;
  local_38._12_4_ = extraout_XMM0_Dd_00;
  local_40.y = 1.0;
  local_40.x = u1;
  vVar1 = cdfv(this,&local_40,zi);
  return (vVar1.x - (float)local_28._0_4_) / ((float)local_38._0_4_ - (float)local_28._0_4_);
}

Assistant:

float_t tab_r::cdf1(float_t u1, float_t zi) const
{
	float_t bmin = cdf(vec2( 0, 1), zi);
	float_t bmax = cdf(vec2( 1, 1), zi);
	float_t eval = cdf(vec2(u1, 1), zi);

	return (eval - bmin) / (bmax - bmin);
}